

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,char value,format_specs<char> *specs,locale_ref loc)

{
  loc_value value_00;
  bool bVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar2;
  ulong uVar3;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  bVar1 = check_char_specs<char>(specs);
  if (bVar1) {
    local_48._0_2_ = (anon_class_2_2_bf5026b7)CONCAT11(value,specs->type == debug);
    bVar2.container =
         (buffer<char> *)
         write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write_char<char,fmt::v10::appender>(fmt::v10::appender,char,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                   (out,specs,1,1,(anon_class_2_2_bf5026b7 *)&local_48);
  }
  else {
    uVar3 = CONCAT71(0,value);
    if ((specs->field_0xa & 1) != 0) {
      local_38 = 2;
      value_00.value_._20_4_ = uStack_34;
      value_00.value_.type_ = 2;
      value_00.value_.value_.field_0.string.size = uStack_40;
      value_00.value_.value_.field_0.ulong_long_value = uVar3;
      value_00.value_._24_8_ = uStack_30;
      local_48 = uVar3;
      bVar1 = write_loc(out,value_00,specs,loc);
      if (bVar1) {
        return (appender)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
      }
    }
    bVar2.container =
         (buffer<char> *)
         write_int_noinline<char,fmt::v10::appender,unsigned_int>
                   (out,(write_int_arg<unsigned_int>)
                        (uVar3 | (ulong)*(uint *)(&DAT_00197ad0 +
                                                 (*(ushort *)&specs->field_0x9 >> 2 & 0x1c)) << 0x20
                        ),specs,loc);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const format_specs<Char>& specs, locale_ref loc = {})
    -> OutputIt {
  // char is formatted as unsigned char for consistency across platforms.
  using unsigned_type =
      conditional_t<std::is_same<Char, char>::value, unsigned char, unsigned>;
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<unsigned_type>(value), specs, loc);
}